

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_x86.c
# Opt level: O0

int handle_rip_relative(make_trampoline_context_t *ctx,rip_relative_t *rel,size_t insn_size)

{
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  if (*(int *)((long)in_RSI + 0x14) == 0x20) {
    if (*(int *)(in_RDI[4] + (long)*(int *)(in_RSI + 2)) != (int)in_RSI[1]) {
      funchook_set_error_message
                ((funchook_t *)*in_RDI,
                 "Invalid ip-relative offset %d. The value at the offset should be %08x but %08x",
                 (ulong)*(uint *)(in_RSI + 2),in_RSI[1] & 0xffffffff,
                 (ulong)*(uint *)(in_RDI[4] + (long)*(int *)(in_RSI + 2)));
      return 4;
    }
    *(undefined8 *)(in_RDI[1] + 0x18) = *in_RSI;
    *(long *)(in_RDI[1] + 0x20) = (in_RDI[4] - in_RDI[3]) + in_RDX;
    *(long *)(in_RDI[1] + 0x28) = (in_RDI[4] - in_RDI[3]) + (long)*(int *)(in_RSI + 2);
  }
  else if (*(int *)((long)in_RSI + 0x14) != 0) {
    funchook_set_error_message
              ((funchook_t *)*in_RDI,"Could not fix ip-relative address. The size is not 32.");
    return 5;
  }
  return 0;
}

Assistant:

static int handle_rip_relative(make_trampoline_context_t *ctx, const rip_relative_t *rel, size_t insn_size)
{
    if (rel->size == 32) {
        if (*(int32_t*)(ctx->dst + rel->offset) != (uint32_t)rel->raddr) {
            /* sanity check.
             * reach here if opsiz and/or disp_offset are incorrectly
             * estimated.
             */
            funchook_set_error_message(ctx->funchook, "Invalid ip-relative offset %d. The value at the offset should be %08x but %08x",
                         rel->offset, (uint32_t)rel->raddr, *(int32_t*)(ctx->dst + rel->offset));
            return FUNCHOOK_ERROR_IP_RELATIVE_OFFSET;
        }
        ctx->rip_disp->disp[1].dst_addr = rel->addr;
        ctx->rip_disp->disp[1].src_addr_offset = (ctx->dst - ctx->dst_base) + insn_size;
        ctx->rip_disp->disp[1].pos_offset = (ctx->dst - ctx->dst_base) + rel->offset;
    } else if (rel->size != 0) {
        funchook_set_error_message(ctx->funchook, "Could not fix ip-relative address. The size is not 32.");
        return FUNCHOOK_ERROR_CANNOT_FIX_IP_RELATIVE;
    }
    return 0;
}